

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::Calc_Sxi_compact
          (ChElementBeamANCF_3333 *this,VectorN *Sxi_compact,double xi,double eta,double zeta)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar3 [16];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = xi;
  auVar3 = auVar4._0_16_;
  auVar1 = vfmsub213sd_fma(auVar3,auVar3,auVar3);
  dVar2 = auVar1._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [0] = dVar2 * 0.5;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [1] = dVar2 * this->m_thicknessY * 0.25 * eta;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [2] = dVar2 * this->m_thicknessZ * 0.25 * zeta;
  auVar1 = vfmadd213sd_fma(auVar3,auVar3,auVar3);
  dVar2 = auVar1._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [3] = dVar2 * 0.5;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [4] = dVar2 * this->m_thicknessY * 0.25 * eta;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [5] = dVar2 * this->m_thicknessZ * 0.25 * zeta;
  auVar1 = vfnmadd213sd_fma(auVar3,auVar3,ZEXT816(0x3ff0000000000000));
  dVar2 = auVar1._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [6] = dVar2;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [7] = dVar2 * this->m_thicknessY * 0.5 * eta;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array
  [8] = dVar2 * this->m_thicknessZ * 0.5 * zeta;
  return;
}

Assistant:

void ChElementBeamANCF_3333::Calc_Sxi_compact(VectorN& Sxi_compact, double xi, double eta, double zeta) {
    Sxi_compact(0) = 0.5 * (xi * xi - xi);
    Sxi_compact(1) = 0.25 * m_thicknessY * eta * (xi * xi - xi);
    Sxi_compact(2) = 0.25 * m_thicknessZ * zeta * (xi * xi - xi);
    Sxi_compact(3) = 0.5 * (xi * xi + xi);
    Sxi_compact(4) = 0.25 * m_thicknessY * eta * (xi * xi + xi);
    Sxi_compact(5) = 0.25 * m_thicknessZ * zeta * (xi * xi + xi);
    Sxi_compact(6) = 1.0 - xi * xi;
    Sxi_compact(7) = 0.5 * m_thicknessY * eta * (1.0 - xi * xi);
    Sxi_compact(8) = 0.5 * m_thicknessZ * zeta * (1.0 - xi * xi);
}